

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashdict.c
# Opt level: O1

void dic_delete(dictionary *dic)

{
  long lVar1;
  
  if (0 < dic->length) {
    lVar1 = 0;
    do {
      if (dic->table[lVar1] != (keynode *)0x0) {
        keynode_delete(dic->table[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < dic->length);
  }
  free(dic->table);
  dic->table = (keynode **)0x0;
  free(dic);
  return;
}

Assistant:

void dic_delete(struct dictionary* dic) {
	for (int i = 0; i < dic->length; i++) {
		if (dic->table[i])
			keynode_delete(dic->table[i]);
	}
	free(dic->table);
	dic->table = 0;
	free(dic);
}